

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O3

Query * q_optimize(Query *__return_storage_ptr__,Query *q)

{
  pointer pQVar1;
  pointer pQVar2;
  QueryType *pQVar3;
  bool local_81;
  Query *local_80;
  Query local_78;
  
  pQVar3 = Query::get_type(q);
  if (*pQVar3 == PRIMITIVE) {
    __return_storage_ptr__->type = q->type;
    pQVar1 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar1;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->count = q->count;
    __return_storage_ptr__->ngram = q->ngram;
    pQVar2 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar2;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
  }
  else {
    local_80 = __return_storage_ptr__;
    simplify_subqueries(&local_78,q);
    Query::operator=(q,&local_78);
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
    do {
      local_81 = false;
      flatten_trivial_operations(&local_78,q,&local_81);
      Query::operator=(q,&local_78);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
      inline_suboperations(&local_78,q,&local_81);
      Query::operator=(q,&local_78);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
      deduplicate_primitives(&local_78,q,&local_81);
      Query::operator=(q,&local_78);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
      simplify_minof(&local_78,q,&local_81);
      Query::operator=(q,&local_78);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
      propagate_degenerate_queries(&local_78,q,&local_81);
      Query::operator=(q,&local_78);
      std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
      std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
    } while (local_81 != false);
    reorder_subqueries(&local_78,q);
    Query::operator=(q,&local_78);
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_78.queries);
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_78.value);
    local_80->type = q->type;
    pQVar1 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (local_80->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_80->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar1;
    (local_80->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_80->count = q->count;
    local_80->ngram = q->ngram;
    pQVar2 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (local_80->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_80->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar2;
    (local_80->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__ = local_80;
  }
  return __return_storage_ptr__;
}

Assistant:

Query q_optimize(Query &&q) {
    if (q.get_type() == QueryType::PRIMITIVE) {
        // Nothing to improve here.
        return std::move(q);
    }

    q = simplify_subqueries(std::move(q));
    bool changed = true;
    while (changed) {
        changed = false;
        q = flatten_trivial_operations(std::move(q), &changed);
        q = inline_suboperations(std::move(q), &changed);
        q = deduplicate_primitives(std::move(q), &changed);
        q = simplify_minof(std::move(q), &changed);
        q = propagate_degenerate_queries(std::move(q), &changed);
    }
    q = reorder_subqueries(std::move(q));
    return std::move(q);
}